

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LSTMParams * __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::mutable_params
          (UniDirectionalLSTMLayerParams *this)

{
  LSTMParams *this_00;
  
  this_00 = this->params_;
  if (this_00 == (LSTMParams *)0x0) {
    this_00 = (LSTMParams *)operator_new(0x20);
    LSTMParams::LSTMParams(this_00);
    this->params_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::LSTMParams* UniDirectionalLSTMLayerParams::mutable_params() {
  
  if (params_ == NULL) {
    params_ = new ::CoreML::Specification::LSTMParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.UniDirectionalLSTMLayerParams.params)
  return params_;
}